

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHandlerCSV.cpp
# Opt level: O0

void __thiscall
DataHandlerCSV::DataHandlerCSV(DataHandlerCSV *this,string *pathToFiles,char delimiter)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  mapped_type mVar5;
  byte bVar6;
  bool bVar7;
  istream *piVar8;
  ulong uVar9;
  ulong *puVar10;
  char *pcVar11;
  size_type sVar12;
  mapped_type *pmVar13;
  ulong uVar14;
  void *pvVar15;
  string *psVar16;
  undefined8 *in_RDI;
  ulong uVar17;
  size_t worker;
  string attrName;
  string tableName;
  size_t table;
  uint_fast16_t attributeID;
  size_t numOfTables;
  stringstream ssLine;
  string line;
  ifstream input;
  key_type *in_stack_fffffffffffffa38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa40;
  ulong *puVar18;
  string *in_stack_fffffffffffffa48;
  ulong *puVar19;
  DataHandler *in_stack_fffffffffffffa50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa68;
  ulong *local_518;
  string *local_4e8;
  ulong local_498;
  string local_490 [32];
  string local_470 [32];
  long local_450;
  mapped_type local_448;
  ulong local_440;
  long local_438 [2];
  ostream local_428 [376];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [48];
  string local_240 [32];
  long local_220 [68];
  
  DataHandler::DataHandler
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
             (char)((ulong)in_stack_fffffffffffffa40 >> 0x38));
  *in_RDI = &PTR__DataHandlerCSV_001f0a08;
  std::operator+(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  std::ifstream::ifstream(local_220,local_240,8);
  std::__cxx11::string::~string(local_240);
  bVar6 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar6 & 1) == 0) {
    std::__cxx11::string::string(local_2b0);
    std::__cxx11::stringstream::stringstream((stringstream *)local_438);
    local_440 = 0;
    while( true ) {
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_220,local_2b0);
      bVar7 = std::ios::operator_cast_to_bool((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
      uVar14 = local_440;
      if (!bVar7) break;
      pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_2b0);
      if ((*pcVar11 != '#') &&
         (bVar7 = std::operator==(in_stack_fffffffffffffa40,(char *)in_stack_fffffffffffffa38),
         !bVar7)) {
        local_440 = local_440 + 1;
      }
    }
    dfdb::params::NUM_OF_TABLES = local_440;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_440;
    uVar9 = SUB168(auVar1 * ZEXT816(0x20),0);
    uVar17 = uVar9 + 8;
    if (0xfffffffffffffff7 < uVar9) {
      uVar17 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    puVar10 = (ulong *)operator_new__(uVar17);
    *puVar10 = uVar14;
    psVar16 = (string *)(puVar10 + 1);
    if (uVar14 != 0) {
      local_4e8 = psVar16;
      do {
        std::__cxx11::string::string(local_4e8);
        local_4e8 = local_4e8 + 0x20;
      } while (local_4e8 != psVar16 + uVar14 * 0x20);
    }
    in_RDI[0xe] = psVar16;
    uVar14 = dfdb::params::NUM_OF_TABLES;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dfdb::params::NUM_OF_TABLES;
    uVar9 = SUB168(auVar2 * ZEXT816(0x18),0);
    uVar17 = uVar9 + 8;
    if (0xfffffffffffffff7 < uVar9) {
      uVar17 = 0xffffffffffffffff;
    }
    if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    puVar10 = (ulong *)operator_new__(uVar17);
    *puVar10 = uVar14;
    puVar10 = puVar10 + 1;
    if (uVar14 != 0) {
      local_518 = puVar10;
      do {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x18d8e1);
        local_518 = local_518 + 3;
      } while (local_518 != puVar10 + uVar14 * 3);
    }
    in_RDI[6] = puVar10;
    std::ios::clear((long)local_220 + *(long *)(local_220[0] + -0x18),0);
    std::istream::seekg((long)local_220,_S_beg);
    local_448 = 0;
    local_450 = 0;
    while( true ) {
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_220,local_2b0);
      bVar7 = std::ios::operator_cast_to_bool((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
      if (!bVar7) break;
      pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_2b0);
      if ((*pcVar11 != '#') &&
         (bVar7 = std::operator==(in_stack_fffffffffffffa40,(char *)in_stack_fffffffffffffa38),
         !bVar7)) {
        std::operator<<(local_428,local_2b0);
        std::__cxx11::string::string(local_470);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_438,local_470,':');
        std::__cxx11::string::operator=((string *)(in_RDI[0xe] + local_450 * 0x20),local_470);
        std::__cxx11::string::string(local_490);
        while( true ) {
          piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_438,local_490,',');
          bVar7 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
          if (!bVar7) break;
          sVar12 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ::count((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
          mVar5 = local_448;
          if (sVar12 == 0) {
            pmVar13 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                    *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
            *pmVar13 = mVar5;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffa50,(value_type_conflict1 *)in_stack_fffffffffffffa48);
            local_448 = local_448 + 1;
          }
          else {
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffa50,(value_type_conflict1 *)in_stack_fffffffffffffa48);
          }
        }
        local_450 = local_450 + 1;
        std::ios::clear((long)local_438 + *(long *)(local_438[0] + -0x18),0);
        std::__cxx11::string::~string(local_490);
        std::__cxx11::string::~string(local_470);
      }
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dfdb::params::NUM_OF_WORKERS;
    uVar14 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar14);
    in_RDI[0x11] = pvVar15;
    for (local_498 = 0; local_498 < dfdb::params::NUM_OF_WORKERS; local_498 = local_498 + 1) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = dfdb::params::NUM_OF_TABLES;
      uVar14 = SUB168(auVar4 * ZEXT816(0x18),0);
      uVar9 = uVar14 + 8;
      if (0xfffffffffffffff7 < uVar14) {
        uVar9 = 0xffffffffffffffff;
      }
      if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      uVar14 = dfdb::params::NUM_OF_TABLES;
      puVar10 = (ulong *)operator_new__(uVar9);
      *puVar10 = uVar14;
      puVar10 = puVar10 + 1;
      if (uVar14 != 0) {
        puVar19 = puVar10 + uVar14 * 3;
        puVar18 = puVar10;
        do {
          std::vector<double_*,_std::allocator<double_*>_>::vector
                    ((vector<double_*,_std::allocator<double_*>_> *)0x18dd4e);
          puVar18 = puVar18 + 3;
        } while (puVar18 != puVar19);
      }
      *(ulong **)(in_RDI[0x11] + local_498 * 8) = puVar10;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_438);
    std::__cxx11::string::~string(local_2b0);
    std::ifstream::~ifstream(local_220);
    return;
  }
  std::operator+(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  std::operator+(in_stack_fffffffffffffa48,(char *)in_stack_fffffffffffffa40);
  std::operator<<((ostream *)&std::cerr,local_270);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_290);
  exit(1);
}

Assistant:

DataHandlerCSV::DataHandlerCSV(const string& pathToFiles, const char delimiter) :
		DataHandler(pathToFiles, delimiter)
{
	/* Load the database schema file into an input stream. */
	ifstream input(_pathToFiles + SCHEMA_CONF);
    
    if (!input)
    {
        ERROR (_pathToFiles + SCHEMA_CONF + " does is not exist. \n");
        exit(1);
    }
    
	/* String and associated stream to receive lines from the file. */
	string line;
	stringstream ssLine;

	size_t numOfTables = 0;

	/* Count the number of tables in the database. */
	while (getline(input, line))
	{
		if (line[0] == COMMENT_CHAR || line == "")
			continue;
		++numOfTables;
	}

	/* Check consistency between compile time flag and runtime value issued from configuration file. */
#ifdef TABLES
	if(TABLES != numOfTables)
	{
		ERROR("Value of compiler flag -DTABLES and number of tables specified in schema.conf inconsistent. Aborting.\n")
		exit(1);
	}
	/* Assign value to extern variable in GlobalParams.hpp. */
#else
	NUM_OF_TABLES = numOfTables;
#endif

	/* Initialise arrays; each element will correspond to one database table. */
	_tableNames = new string[NUM_OF_TABLES];
	_attrIDs = new vector<uint_fast16_t> [NUM_OF_TABLES];

	/* Reset input stream to beginning of file. */
	input.clear();
	input.seekg(0, ios::beg);

	/* Variable defining the ID of each attribute. */
	uint_fast16_t attributeID = 0;

	size_t table = 0;
	/* Scan through the input stream line by line. */
	while (getline(input, line))
	{
		if (line[0] == COMMENT_CHAR || line == "")
			continue;

		ssLine << line;

		string tableName;
		/* Extract the name of the table in the current line. */
		getline(ssLine, tableName, TABLE_NAME_CHAR);
		_tableNames[table] = tableName;

		string attrName;
		/* Scan through the attributes in the current line. */
		while (getline(ssLine, attrName, ATTRIBUTE_SEPARATOR_CHAR))
		{
			/* Attribute encountered for the first time in the schema: give it a new ID. */
			if (_namesMapping.count(attrName) == 0)
			{
				_namesMapping[attrName] = attributeID;
				_attrIDs[table].push_back(attributeID);
				++attributeID;
			}
			/* Attribute already encountered: just add its ID to the vector of IDs for the current table. */
			else
			{
				_attrIDs[table].push_back(_namesMapping[attrName]);
			}
		}
		++table;
		/* Clear string stream. */
		ssLine.clear();
	}
	assert(
			table == NUM_OF_TABLES
					&& "The same number of lines must be processed during the first and the second pass over the schema file.");

	/* Initialise array; each element will correspond to one orker in the network. */
	_receivedDataToProcess = new Database[NUM_OF_WORKERS];
	for (size_t worker = 0; worker < NUM_OF_WORKERS; ++worker)
	{
		_receivedDataToProcess[worker] = new Table[NUM_OF_TABLES];
	}
}